

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O2

unsigned_long tjPlaneSizeYUV(int componentID,int width,int stride,int height,int subsamp)

{
  uint uVar1;
  uint uVar2;
  char *pcVar3;
  ulong uVar4;
  
  if ((height < 1 || width < 1) || 5 < (uint)subsamp) {
    pcVar3 = (char *)__tls_get_addr(&PTR_00199f20);
    builtin_strncpy(pcVar3,"tjPlaneSizeYUV(): Invalid argument",0x23);
  }
  else {
    uVar1 = tjPlaneWidth(componentID,width,subsamp);
    uVar2 = tjPlaneHeight(componentID,height,subsamp);
    if (-1 < (int)(uVar1 | uVar2)) {
      uVar4 = (ulong)(uint)-stride;
      if (0 < stride) {
        uVar4 = (ulong)(uint)stride;
      }
      if (stride == 0) {
        uVar4 = (ulong)uVar1;
      }
      return (ulong)uVar1 + (long)(int)(uVar2 - 1) * uVar4;
    }
  }
  return 0xffffffffffffffff;
}

Assistant:

DLLEXPORT unsigned long tjPlaneSizeYUV(int componentID, int width, int stride,
                                       int height, int subsamp)
{
  unsigned long long retval = 0;
  int pw, ph;

  if (width < 1 || height < 1 || subsamp < 0 || subsamp >= NUMSUBOPT)
    THROWG("tjPlaneSizeYUV(): Invalid argument");

  pw = tjPlaneWidth(componentID, width, subsamp);
  ph = tjPlaneHeight(componentID, height, subsamp);
  if (pw < 0 || ph < 0) return -1;

  if (stride == 0) stride = pw;
  else stride = abs(stride);

  retval = (unsigned long long)stride * (ph - 1) + pw;
  if (retval > (unsigned long long)((unsigned long)-1))
    THROWG("tjPlaneSizeYUV(): Image is too large");

bailout:
  return (unsigned long)retval;
}